

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O3

duckdb_state
duckdb_register_aggregate_function_set
          (duckdb_connection connection,duckdb_aggregate_function_set function_set)

{
  duckdb_aggregate_function_set this;
  LogicalType *type;
  pointer pLVar1;
  bool bVar2;
  duckdb_state dVar3;
  reference pvVar4;
  AggregateFunctionInfo *pAVar5;
  ClientContext *this_00;
  LogicalType *argument;
  pointer type_00;
  size_type __n;
  Connection *con;
  duckdb_connection local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  duckdb_connection local_40;
  duckdb_aggregate_function_set local_38;
  
  dVar3 = DuckDBError;
  if (function_set != (duckdb_aggregate_function_set)0x0 && connection != (duckdb_connection)0x0) {
    local_40 = connection;
    if (*(long *)(function_set + 0x28) != *(long *)(function_set + 0x20)) {
      this = function_set + 0x20;
      __n = 0;
      local_38 = function_set;
      do {
        pvVar4 = duckdb::vector<duckdb::AggregateFunction,_true>::operator[]
                           ((vector<duckdb::AggregateFunction,_true> *)this,__n);
        pAVar5 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                           (&pvVar4->function_info);
        if (((((pvVar4->super_BaseScalarFunction).super_SimpleFunction.super_Function.name.
               _M_string_length == 0) ||
             (pAVar5[3]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) ||
            (pAVar5[4]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) ||
           (pAVar5[5]._vptr_AggregateFunctionInfo == (_func_int **)0x0)) {
          return DuckDBError;
        }
        type = &(pvVar4->super_BaseScalarFunction).return_type;
        local_68 = (duckdb_connection)((ulong)local_68 & 0xffffffffffffff00);
        local_60._M_unused._M_object = &local_68;
        bVar2 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (type,(anon_class_8_1_50811320 *)&local_60);
        if (bVar2) {
          return DuckDBError;
        }
        local_68 = (duckdb_connection)CONCAT71(local_68._1_7_,3);
        local_60._M_unused._M_object = &local_68;
        bVar2 = duckdb::TypeVisitor::
                Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                          (type,(anon_class_8_1_50811320 *)&local_60);
        if (bVar2) {
          return DuckDBError;
        }
        pLVar1 = *(pointer *)
                  ((long)&(pvVar4->super_BaseScalarFunction).super_SimpleFunction.arguments.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data + 8);
        for (type_00 = (pvVar4->super_BaseScalarFunction).super_SimpleFunction.arguments.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start; type_00 != pLVar1;
            type_00 = type_00 + 1) {
          local_68 = (duckdb_connection)((ulong)local_68 & 0xffffffffffffff00);
          local_60._M_unused._M_object = &local_68;
          bVar2 = duckdb::TypeVisitor::
                  Contains<duckdb::TypeVisitor::Contains(duckdb::LogicalType_const&,duckdb::LogicalTypeId)::_lambda(duckdb::LogicalType_const&)_1_>
                            (type_00,(anon_class_8_1_50811320 *)&local_60);
          if (bVar2) {
            return DuckDBError;
          }
        }
        __n = __n + 1;
        function_set = local_38;
      } while (__n < (ulong)((*(long *)(local_38 + 0x28) - *(long *)(local_38 + 0x20) >> 4) *
                            -0x79435e50d79435e5));
    }
    local_68 = local_40;
    this_00 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                        ((shared_ptr<duckdb::ClientContext,_true> *)local_40);
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/capi/aggregate_function-c.cpp:318:42)>
               ::_M_manager;
    local_60._M_unused._M_object = &local_68;
    local_60._8_8_ = function_set;
    duckdb::ClientContext::RunFunctionInTransaction(this_00,(function<void_()> *)&local_60,true);
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    dVar3 = DuckDBSuccess;
  }
  return dVar3;
}

Assistant:

duckdb_state duckdb_register_aggregate_function_set(duckdb_connection connection,
                                                    duckdb_aggregate_function_set function_set) {
	if (!connection || !function_set) {
		return DuckDBError;
	}
	auto &set = duckdb::GetCAggregateFunctionSet(function_set);
	for (idx_t idx = 0; idx < set.Size(); idx++) {
		auto &aggregate_function = set.GetFunctionReferenceByOffset(idx);
		auto &info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();

		if (aggregate_function.name.empty() || !info.update || !info.combine || !info.finalize) {
			return DuckDBError;
		}
		if (duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::INVALID) ||
		    duckdb::TypeVisitor::Contains(aggregate_function.return_type, duckdb::LogicalTypeId::ANY)) {
			return DuckDBError;
		}
		for (const auto &argument : aggregate_function.arguments) {
			if (duckdb::TypeVisitor::Contains(argument, duckdb::LogicalTypeId::INVALID)) {
				return DuckDBError;
			}
		}
	}

	try {
		auto con = reinterpret_cast<duckdb::Connection *>(connection);
		con->context->RunFunctionInTransaction([&]() {
			auto &catalog = duckdb::Catalog::GetSystemCatalog(*con->context);
			duckdb::CreateAggregateFunctionInfo sf_info(set);
			catalog.CreateFunction(*con->context, sf_info);
		});
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}